

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

VariableID __thiscall spirv_cross::Compiler::build_dummy_sampler_for_combined_images(Compiler *this)

{
  uint32_t id;
  SPIRFunction *func;
  allocator local_a1;
  string local_a0;
  ID local_80;
  int local_7c [2];
  TypedID<(spirv_cross::Types)1> local_74;
  TypedID<(spirv_cross::Types)0> local_70;
  Op local_6c;
  SPIRType *local_68;
  SPIRType *ptr_sampler;
  SPIRType *local_58;
  SPIRType *sampler;
  uint32_t local_48;
  uint32_t var_id;
  uint32_t ptr_type_id;
  uint32_t type_id;
  uint32_t offset;
  undefined1 local_30 [8];
  DummySamplerForCombinedImageHandler handler;
  Compiler *this_local;
  
  handler._16_8_ = this;
  DummySamplerForCombinedImageHandler::DummySamplerForCombinedImageHandler
            ((DummySamplerForCombinedImageHandler *)local_30,this);
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
  func = get<spirv_cross::SPIRFunction>(this,id);
  traverse_all_reachable_opcodes(this,func,(OpcodeHandler *)local_30);
  if (((byte)handler.compiler & 1) == 0) {
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4),0);
  }
  else {
    var_id = ParsedIR::increase_bound_by(&this->ir,3);
    local_48 = var_id + 1;
    sampler._4_4_ = var_id + 2;
    ptr_sampler._4_4_ = 0x1a;
    ptr_type_id = var_id;
    local_58 = set<spirv_cross::SPIRType,spv::Op>(this,var_id,(Op *)((long)&ptr_sampler + 4));
    local_58->basetype = Sampler;
    local_6c = OpTypePointer;
    local_68 = set<spirv_cross::SPIRType,spv::Op>(this,local_48,&local_6c);
    SPIRType::operator=(local_68,local_58);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_70,var_id);
    (local_68->super_IVariant).self.id = local_70.id;
    local_68->storage = StorageClassUniformConstant;
    local_68->pointer = true;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_74,var_id);
    (local_68->parent_type).id = local_74.id;
    local_7c[1] = 0;
    local_7c[0] = 0;
    set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
              (this,sampler._4_4_,&local_48,(StorageClass *)(local_7c + 1),local_7c);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_80,sampler._4_4_);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a0,"SPIRV_Cross_DummySampler",&local_a1);
    set_name(this,local_80,&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    this->dummy_sampler_id = sampler._4_4_;
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4),sampler._4_4_);
  }
  DummySamplerForCombinedImageHandler::~DummySamplerForCombinedImageHandler
            ((DummySamplerForCombinedImageHandler *)local_30);
  return (VariableID)this_local._4_4_;
}

Assistant:

VariableID Compiler::build_dummy_sampler_for_combined_images()
{
	DummySamplerForCombinedImageHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
	if (handler.need_dummy_sampler)
	{
		uint32_t offset = ir.increase_bound_by(3);
		auto type_id = offset + 0;
		auto ptr_type_id = offset + 1;
		auto var_id = offset + 2;

		auto &sampler = set<SPIRType>(type_id, OpTypeSampler);
		sampler.basetype = SPIRType::Sampler;

		auto &ptr_sampler = set<SPIRType>(ptr_type_id, OpTypePointer);
		ptr_sampler = sampler;
		ptr_sampler.self = type_id;
		ptr_sampler.storage = StorageClassUniformConstant;
		ptr_sampler.pointer = true;
		ptr_sampler.parent_type = type_id;

		set<SPIRVariable>(var_id, ptr_type_id, StorageClassUniformConstant, 0);
		set_name(var_id, "SPIRV_Cross_DummySampler");
		dummy_sampler_id = var_id;
		return var_id;
	}
	else
		return 0;
}